

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oslib-posix.c
# Opt level: O0

void * qemu_anon_ram_alloc(uc_struct *uc,size_t size,uint64_t *alignment)

{
  void *ptr;
  size_t align;
  uint64_t *alignment_local;
  size_t size_local;
  uc_struct *uc_local;
  
  uc_local = (uc_struct *)qemu_ram_mmap(uc,size,0x200000,false);
  if (uc_local == (uc_struct *)0xffffffffffffffff) {
    uc_local = (uc_struct *)0x0;
  }
  else if (alignment != (uint64_t *)0x0) {
    *alignment = 0x200000;
  }
  return uc_local;
}

Assistant:

void *qemu_anon_ram_alloc(struct uc_struct *uc, size_t size, uint64_t *alignment)
{
#ifdef __MINGW32__
    void *ptr;

    ptr = VirtualAlloc(NULL, size, MEM_COMMIT, PAGE_READWRITE);
    // trace_qemu_anon_ram_alloc(size, ptr);

    if (ptr && alignment) {
        *alignment = MAX(get_allocation_granularity(), getpagesize());
    }
    return ptr;
#else
    size_t align = QEMU_VMALLOC_ALIGN;
    void *ptr = qemu_ram_mmap(uc, size, align, false);

    if (ptr == MAP_FAILED) {
        return NULL;
    }

    if (alignment) {
        *alignment = align;
    }

    //trace_qemu_anon_ram_alloc(size, ptr);
    return ptr;
#endif
}